

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.h
# Opt level: O2

bool __thiscall Js::FunctionBody::DoStackFrameDisplay(FunctionBody *this)

{
  bool bVar1;
  uint sourceContextId;
  LocalFunctionId functionId;
  
  bVar1 = DoStackClosure<Js::FunctionBody_const*>(this);
  if (bVar1) {
    sourceContextId = FunctionProxy::GetSourceContextId((FunctionProxy *)this);
    functionId = FunctionProxy::GetLocalFunctionId((FunctionProxy *)this);
    bVar1 = Phases::IsEnabled((Phases *)&DAT_01441eb0,StackClosurePhase,sourceContextId,functionId);
    bVar1 = !bVar1;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool DoStackFrameDisplay() const { return DoStackClosure(this) && !PHASE_OFF(StackClosurePhase, this); }